

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cc
# Opt level: O0

void __thiscall HighVariable::merge(HighVariable *this,HighVariable *tv2,bool isspeculative)

{
  Varnode *pVVar1;
  HighVariable *pHVar2;
  int2 iVar3;
  ulong uVar4;
  size_type sVar5;
  reference ppVVar6;
  LowlevelError *this_00;
  size_type sVar7;
  iterator __first1;
  iterator __last1;
  iterator __first2;
  iterator __last2;
  iterator __result;
  value_type local_88;
  undefined1 local_80 [8];
  vector<Varnode_*,_std::allocator<Varnode_*>_> instcopy;
  Varnode *vn_1;
  allocator local_49;
  string local_48 [32];
  Varnode *local_28;
  Varnode *vn;
  int4 i;
  bool isspeculative_local;
  HighVariable *tv2_local;
  HighVariable *this_local;
  
  if (tv2 != this) {
    this->highflags = this->highflags | 3;
    vn._7_1_ = isspeculative;
    _i = tv2;
    tv2_local = this;
    if (isspeculative) {
      for (vn._0_4_ = 0; uVar4 = (ulong)(int)vn,
          sVar5 = std::vector<Varnode_*,_std::allocator<Varnode_*>_>::size(&_i->inst), uVar4 < sVar5
          ; vn._0_4_ = (int)vn + 1) {
        ppVVar6 = std::vector<Varnode_*,_std::allocator<Varnode_*>_>::operator[]
                            (&_i->inst,(long)(int)vn);
        pVVar1 = *ppVVar6;
        local_28 = pVVar1;
        iVar3 = Varnode::getMergeGroup(pVVar1);
        Varnode::setHigh(pVVar1,this,iVar3 + (short)this->numMergeClasses);
      }
      this->numMergeClasses = _i->numMergeClasses + this->numMergeClasses;
    }
    else {
      if ((this->numMergeClasses != 1) || (tv2->numMergeClasses != 1)) {
        this_00 = (LowlevelError *)__cxa_allocate_exception(0x20);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_48,"Making a non-speculative merge after speculative merges have occurred",
                   &local_49);
        LowlevelError::LowlevelError(this_00,(string *)local_48);
        __cxa_throw(this_00,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
      }
      for (vn._0_4_ = 0; uVar4 = (ulong)(int)vn,
          sVar5 = std::vector<Varnode_*,_std::allocator<Varnode_*>_>::size(&_i->inst), uVar4 < sVar5
          ; vn._0_4_ = (int)vn + 1) {
        ppVVar6 = std::vector<Varnode_*,_std::allocator<Varnode_*>_>::operator[]
                            (&_i->inst,(long)(int)vn);
        pVVar1 = *ppVVar6;
        instcopy.super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)pVVar1;
        iVar3 = Varnode::getMergeGroup(pVVar1);
        Varnode::setHigh(pVVar1,this,iVar3);
      }
    }
    std::vector<Varnode_*,_std::allocator<Varnode_*>_>::vector
              ((vector<Varnode_*,_std::allocator<Varnode_*>_> *)local_80,&this->inst);
    sVar5 = std::vector<Varnode_*,_std::allocator<Varnode_*>_>::size(&this->inst);
    sVar7 = std::vector<Varnode_*,_std::allocator<Varnode_*>_>::size(&_i->inst);
    local_88 = (value_type)0x0;
    std::vector<Varnode_*,_std::allocator<Varnode_*>_>::resize(&this->inst,sVar5 + sVar7,&local_88);
    __first1 = std::vector<Varnode_*,_std::allocator<Varnode_*>_>::begin
                         ((vector<Varnode_*,_std::allocator<Varnode_*>_> *)local_80);
    __last1 = std::vector<Varnode_*,_std::allocator<Varnode_*>_>::end
                        ((vector<Varnode_*,_std::allocator<Varnode_*>_> *)local_80);
    __first2 = std::vector<Varnode_*,_std::allocator<Varnode_*>_>::begin(&_i->inst);
    __last2 = std::vector<Varnode_*,_std::allocator<Varnode_*>_>::end(&_i->inst);
    __result = std::vector<Varnode_*,_std::allocator<Varnode_*>_>::begin(&this->inst);
    std::
    merge<__gnu_cxx::__normal_iterator<Varnode**,std::vector<Varnode*,std::allocator<Varnode*>>>,__gnu_cxx::__normal_iterator<Varnode**,std::vector<Varnode*,std::allocator<Varnode*>>>,__gnu_cxx::__normal_iterator<Varnode**,std::vector<Varnode*,std::allocator<Varnode*>>>,bool(*)(Varnode_const*,Varnode_const*)>
              ((__normal_iterator<Varnode_**,_std::vector<Varnode_*,_std::allocator<Varnode_*>_>_>)
               __first1._M_current,
               (__normal_iterator<Varnode_**,_std::vector<Varnode_*,_std::allocator<Varnode_*>_>_>)
               __last1._M_current,
               (__normal_iterator<Varnode_**,_std::vector<Varnode_*,_std::allocator<Varnode_*>_>_>)
               __first2._M_current,
               (__normal_iterator<Varnode_**,_std::vector<Varnode_*,_std::allocator<Varnode_*>_>_>)
               __last2._M_current,
               (__normal_iterator<Varnode_**,_std::vector<Varnode_*,_std::allocator<Varnode_*>_>_>)
               __result._M_current,compareJustLoc);
    std::vector<Varnode_*,_std::allocator<Varnode_*>_>::clear(&_i->inst);
    if (((this->highflags & 4) == 0) && ((_i->highflags & 4) == 0)) {
      Cover::merge(&this->wholecover,&_i->wholecover);
    }
    else {
      this->highflags = this->highflags | 4;
    }
    pHVar2 = _i;
    if (_i != (HighVariable *)0x0) {
      ~HighVariable(_i);
      operator_delete(pHVar2);
    }
    std::vector<Varnode_*,_std::allocator<Varnode_*>_>::~vector
              ((vector<Varnode_*,_std::allocator<Varnode_*>_> *)local_80);
  }
  return;
}

Assistant:

void HighVariable::merge(HighVariable *tv2,bool isspeculative)

{
  int4 i;

  if (tv2 == this) return;

//   if (isAddrTied() && tv2->isAddrTied()) {
//     if (tied_varnode()->getAddr() != tv2->tied_varnode()->getAddr())
//       throw LowlevelError("Merging different addrtieds");
//   }

  highflags |= (HighVariable::flagsdirty|HighVariable::typedirty);

  if (isspeculative) {
    for(i=0;i<tv2->inst.size();++i) {
      Varnode *vn = tv2->inst[i];
      vn->setHigh(this,vn->getMergeGroup() + numMergeClasses);
    }
    numMergeClasses += tv2->numMergeClasses;
  }
  else {
    if ((numMergeClasses!=1)||(tv2->numMergeClasses!=1))
      throw LowlevelError("Making a non-speculative merge after speculative merges have occurred");
    for(i=0;i<tv2->inst.size();++i) {
      Varnode *vn = tv2->inst[i];
      vn->setHigh(this,vn->getMergeGroup());
    }
  }
  vector<Varnode *> instcopy(inst);
  inst.resize(inst.size()+tv2->inst.size(),(Varnode *)0);
  std::merge(instcopy.begin(),instcopy.end(),tv2->inst.begin(),tv2->inst.end(),inst.begin(),compareJustLoc);
  tv2->inst.clear();

  if (((highflags&HighVariable::coverdirty)==0)&&((tv2->highflags&HighVariable::coverdirty)==0))
    wholecover.merge(tv2->wholecover);
  else
    highflags |= HighVariable::coverdirty;

  delete tv2;
}